

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O2

bool QtPrivate::sequential_erase_one<QList<QWindow*>,QWindow*>(QList<QWindow_*> *c,QWindow **t)

{
  QWindow **ppQVar1;
  QWindow **ppQVar2;
  const_iterator pos;
  
  ppQVar2 = (c->d).ptr;
  ppQVar1 = ppQVar2 + (c->d).size;
  pos = std::
        __find_if<QList<QWindow*>::const_iterator,__gnu_cxx::__ops::_Iter_equals_val<QWindow*const>>
                  (ppQVar2,ppQVar1,t);
  if (pos.i != ppQVar1) {
    QList<QWindow_*>::erase(c,pos);
  }
  return pos.i != ppQVar1;
}

Assistant:

auto sequential_erase_one(Container &c, const T &t)
{
    const auto cend = c.cend();
    const auto it = std::find(c.cbegin(), cend, t);
    if (it == cend)
        return false;
    c.erase(it);
    return true;
}